

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeBase *
MatchArgumentType(ExpressionContext *ctx,SynBase *source,TypeBase *expectedType,TypeBase *actualType
                 ,ExprBase *actualValue,IntrusiveList<MatchData> *aliases)

{
  bool_type bVar1;
  TypeBase *pTVar2;
  undefined1 local_60 [8];
  FunctionValue bestOverload;
  TypeFunction *target;
  IntrusiveList<MatchData> *aliases_local;
  ExprBase *actualValue_local;
  TypeBase *actualType_local;
  TypeBase *expectedType_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  actualValue_local = (ExprBase *)actualType;
  if ((actualType->isGeneric & 1U) != 0) {
    bestOverload.context = (ExprBase *)getType<TypeFunction>(expectedType);
    if ((TypeFunction *)bestOverload.context != (TypeFunction *)0x0) {
      GetFunctionForType((FunctionValue *)local_60,ctx,source,actualValue,
                         (TypeFunction *)bestOverload.context);
      bVar1 = FunctionValue::operator_cast_to_function_pointer((FunctionValue *)local_60);
      if (bVar1 != 0) {
        actualValue_local = (ExprBase *)((bestOverload.source)->pos).end;
      }
    }
    if ((actualValue_local[1].field_0xc & 1) != 0) {
      return (TypeBase *)0x0;
    }
  }
  pTVar2 = MatchGenericType(ctx,source,expectedType,(TypeBase *)actualValue_local,aliases,
                            (bool)((actualValue != (ExprBase *)0x0 ^ 0xffU) & 1));
  return pTVar2;
}

Assistant:

TypeBase* MatchArgumentType(ExpressionContext &ctx, SynBase *source, TypeBase *expectedType, TypeBase *actualType, ExprBase *actualValue, IntrusiveList<MatchData> &aliases)
{
	if(actualType->isGeneric)
	{
		if(TypeFunction *target = getType<TypeFunction>(expectedType))
		{
			if(FunctionValue bestOverload = GetFunctionForType(ctx, source, actualValue, target))
				actualType = bestOverload.function->type;
		}

		if(actualType->isGeneric)
			return NULL;
	}

	return MatchGenericType(ctx, source, expectedType, actualType, aliases, !actualValue);
}